

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

GCObject **
sweepgen(lua_State *L,global_State *g,GCObject **p,GCObject *limit,GCObject **pfirstold1,
        l_mem *paddedold)

{
  byte bVar1;
  byte bVar2;
  GCObject *pGVar3;
  l_mem lVar4;
  long lVar5;
  GCObject *pGVar6;
  
  if (*p == limit) {
    lVar5 = 0;
  }
  else {
    bVar1 = g->currentwhite;
    lVar5 = 0;
    pGVar6 = (GCObject *)p;
    pGVar3 = *p;
    do {
      p = &pGVar3->next;
      bVar2 = ((GCObject *)p)->marked;
      if ((bVar2 & 0x18) == 0) {
        if ((bVar2 & 7) == 0) {
          ((GCObject *)p)->marked = bVar2 & 0xc0 | bVar1 & 0x18 | 1;
        }
        else {
          ((GCObject *)p)->marked = bVar2 & 0xe0 | "\x01\x03\x03\x04\x04\x05\x06"[bVar2 & 7];
          if ((bVar2 & 7) < 3) {
            lVar4 = objsize((GCObject *)p);
            lVar5 = lVar5 + lVar4;
            if (*pfirstold1 == (GCObject *)0x0) {
              *pfirstold1 = (GCObject *)p;
            }
          }
        }
      }
      else {
        pGVar6->next = ((GCObject *)p)->next;
        freeobj(L,(GCObject *)p);
        p = &pGVar6->next;
      }
      pGVar6 = (GCObject *)p;
      pGVar3 = ((GCObject *)p)->next;
    } while (((GCObject *)p)->next != limit);
  }
  *paddedold = *paddedold + lVar5;
  return &((GCObject *)p)->next;
}

Assistant:

static GCObject **sweepgen (lua_State *L, global_State *g, GCObject **p,
                            GCObject *limit, GCObject **pfirstold1,
                            l_mem *paddedold) {
  static const lu_byte nextage[] = {
    G_SURVIVAL,  /* from G_NEW */
    G_OLD1,      /* from G_SURVIVAL */
    G_OLD1,      /* from G_OLD0 */
    G_OLD,       /* from G_OLD1 */
    G_OLD,       /* from G_OLD (do not change) */
    G_TOUCHED1,  /* from G_TOUCHED1 (do not change) */
    G_TOUCHED2   /* from G_TOUCHED2 (do not change) */
  };
  l_mem addedold = 0;
  int white = luaC_white(g);
  GCObject *curr;
  while ((curr = *p) != limit) {
    if (iswhite(curr)) {  /* is 'curr' dead? */
      lua_assert(!isold(curr) && isdead(g, curr));
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* correct mark and age */
      int age = getage(curr);
      if (age == G_NEW) {  /* new objects go back to white */
        int marked = curr->marked & ~maskgcbits;  /* erase GC bits */
        curr->marked = cast_byte(marked | G_SURVIVAL | white);
      }
      else {  /* all other objects will be old, and so keep their color */
        lua_assert(age != G_OLD1);  /* advanced in 'markold' */
        setage(curr, nextage[age]);
        if (getage(curr) == G_OLD1) {
          addedold += objsize(curr);  /* bytes becoming old */
          if (*pfirstold1 == NULL)
            *pfirstold1 = curr;  /* first OLD1 object in the list */
        }
      }
      p = &curr->next;  /* go to next element */
    }
  }
  *paddedold += addedold;
  return p;
}